

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opener_file_system.hpp
# Opt level: O1

string * __thiscall
duckdb::OpenerFileSystem::GetName_abi_cxx11_(string *__return_storage_ptr__,OpenerFileSystem *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_type *psVar4;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  iVar2 = (*(this->super_FileSystem)._vptr_FileSystem[0x2c])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x140))(local_30);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x1e4ed6e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override {
		return "OpenerFileSystem - " + GetFileSystem().GetName();
	}